

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimCreator.cpp
# Opt level: O0

void __thiscall OpenMD::SimCreator::computeStorageLayouts(SimCreator *this,SimInfo *info)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  Globals *this_00;
  reference ppAVar10;
  SimInfo *in_RSI;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  PolarizableAdapter pa;
  SuttonChenAdapter sca;
  EAMAdapter ea;
  MultipoleAdapter ma;
  DirectionalAdapter da;
  int cutoffGroupStorageLayout;
  int rigidBodyStorageLayout;
  int atomStorageLayout;
  bool hasMetallic;
  bool hasFluctuatingCharge;
  bool hasPolarizable;
  bool hasQuadrupoles;
  bool hasDipoles;
  bool hasFixedCharge;
  bool hasDirectionalAtoms;
  iterator i;
  AtomTypeSet atomTypes;
  int nRigidBodies;
  Globals *simParams;
  set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  *in_stack_fffffffffffffeb8;
  undefined5 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec5;
  undefined1 in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  undefined4 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff2d;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  FluctuatingChargeAdapter local_c8;
  FixedChargeAdapter local_c0;
  PolarizableAdapter in_stack_ffffffffffffff48;
  SuttonChenAdapter local_b0;
  EAMAdapter local_a8;
  MultipoleAdapter local_a0 [3];
  DirectionalAdapter local_88;
  _Self local_80;
  _Base_ptr local_78;
  int local_6c;
  uint local_68;
  uint local_64;
  byte local_5f;
  byte local_5e;
  byte local_5d;
  byte local_5c;
  byte local_5b;
  byte local_5a;
  byte local_59;
  _Rb_tree_const_iterator<OpenMD::AtomType_*> local_58 [3];
  RNEMDParameters *in_stack_ffffffffffffffc0;
  
  this_00 = SimInfo::getSimParams(in_RSI);
  iVar9 = SimInfo::getNGlobalRigidBodies(in_RSI);
  SimInfo::getSimulatedAtomTypes((SimInfo *)in_stack_ffffffffffffff48.at_);
  std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::_Rb_tree_const_iterator(local_58);
  local_59 = 0;
  local_5a = 0;
  local_5b = 0;
  local_5c = 0;
  local_5d = 0;
  local_5e = 0;
  local_5f = 0;
  local_68 = 0;
  local_64 = 7;
  local_6c = 1;
  local_78 = (_Base_ptr)
             std::
             set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::
             begin(in_stack_fffffffffffffeb8);
  local_58[0]._M_node = local_78;
  while( true ) {
    local_80._M_node =
         (_Base_ptr)
         std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
         ::end(in_stack_fffffffffffffeb8);
    bVar2 = std::operator!=(local_58,&local_80);
    if (!bVar2) break;
    ppAVar10 = std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*
                         ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)
                          CONCAT17(in_stack_fffffffffffffec7,
                                   CONCAT16(in_stack_fffffffffffffec6,
                                            CONCAT15(in_stack_fffffffffffffec5,
                                                     in_stack_fffffffffffffec0))));
    DirectionalAdapter::DirectionalAdapter(&local_88,*ppAVar10);
    ppAVar10 = std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*
                         ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)
                          CONCAT17(in_stack_fffffffffffffec7,
                                   CONCAT16(in_stack_fffffffffffffec6,
                                            CONCAT15(in_stack_fffffffffffffec5,
                                                     in_stack_fffffffffffffec0))));
    MultipoleAdapter::MultipoleAdapter(local_a0,*ppAVar10);
    ppAVar10 = std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*
                         ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)
                          CONCAT17(in_stack_fffffffffffffec7,
                                   CONCAT16(in_stack_fffffffffffffec6,
                                            CONCAT15(in_stack_fffffffffffffec5,
                                                     in_stack_fffffffffffffec0))));
    EAMAdapter::EAMAdapter(&local_a8,*ppAVar10);
    ppAVar10 = std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*
                         ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)
                          CONCAT17(in_stack_fffffffffffffec7,
                                   CONCAT16(in_stack_fffffffffffffec6,
                                            CONCAT15(in_stack_fffffffffffffec5,
                                                     in_stack_fffffffffffffec0))));
    SuttonChenAdapter::SuttonChenAdapter(&local_b0,*ppAVar10);
    ppAVar10 = std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*
                         ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)
                          CONCAT17(in_stack_fffffffffffffec7,
                                   CONCAT16(in_stack_fffffffffffffec6,
                                            CONCAT15(in_stack_fffffffffffffec5,
                                                     in_stack_fffffffffffffec0))));
    PolarizableAdapter::PolarizableAdapter((PolarizableAdapter *)&stack0xffffffffffffff48,*ppAVar10)
    ;
    ppAVar10 = std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*
                         ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)
                          CONCAT17(in_stack_fffffffffffffec7,
                                   CONCAT16(in_stack_fffffffffffffec6,
                                            CONCAT15(in_stack_fffffffffffffec5,
                                                     in_stack_fffffffffffffec0))));
    FixedChargeAdapter::FixedChargeAdapter(&local_c0,*ppAVar10);
    ppAVar10 = std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*
                         ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)
                          CONCAT17(in_stack_fffffffffffffec7,
                                   CONCAT16(in_stack_fffffffffffffec6,
                                            CONCAT15(in_stack_fffffffffffffec5,
                                                     in_stack_fffffffffffffec0))));
    FluctuatingChargeAdapter::FluctuatingChargeAdapter(&local_c8,*ppAVar10);
    bVar2 = DirectionalAdapter::isDirectional((DirectionalAdapter *)0x22317d);
    if (bVar2) {
      local_59 = 1;
    }
    bVar2 = MultipoleAdapter::isDipole
                      ((MultipoleAdapter *)
                       CONCAT17(in_stack_ffffffffffffff2f,
                                CONCAT16(in_stack_ffffffffffffff2e,
                                         CONCAT15(in_stack_ffffffffffffff2d,
                                                  CONCAT14(in_stack_ffffffffffffff2c,
                                                           in_stack_ffffffffffffff28)))));
    if (bVar2) {
      local_5b = 1;
    }
    bVar2 = MultipoleAdapter::isQuadrupole
                      ((MultipoleAdapter *)
                       CONCAT17(in_stack_ffffffffffffff2f,
                                CONCAT16(in_stack_ffffffffffffff2e,
                                         CONCAT15(in_stack_ffffffffffffff2d,
                                                  CONCAT14(in_stack_ffffffffffffff2c,
                                                           in_stack_ffffffffffffff28)))));
    if (bVar2) {
      local_5c = 1;
    }
    bVar2 = EAMAdapter::isEAM((EAMAdapter *)0x223214);
    if ((bVar2) || (bVar2 = SuttonChenAdapter::isSuttonChen((SuttonChenAdapter *)0x223231), bVar2))
    {
      local_5f = 1;
    }
    bVar2 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)0x223256);
    if (bVar2) {
      local_5a = 1;
    }
    bVar2 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x22327b);
    if (bVar2) {
      local_5e = 1;
    }
    bVar2 = PolarizableAdapter::isPolarizable((PolarizableAdapter *)0x2232a0);
    if (bVar2) {
      local_5d = 1;
    }
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator++
              ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)
               CONCAT17(in_stack_fffffffffffffec7,
                        CONCAT16(in_stack_fffffffffffffec6,
                                 CONCAT15(in_stack_fffffffffffffec5,in_stack_fffffffffffffec0))));
  }
  if (0 < iVar9) {
    local_68 = local_68 | 0x3f;
  }
  if ((local_59 & 1) != 0) {
    uVar1 = local_64 | 8;
    if ((local_64 & 2) != 0) {
      uVar1 = local_64 | 0x18;
    }
    local_64 = uVar1;
    if ((local_64 & 4) != 0) {
      local_64 = local_64 | 0x20;
    }
  }
  if ((local_5b & 1) != 0) {
    local_64 = local_64 | 0x400;
  }
  if ((local_5c & 1) != 0) {
    local_64 = local_64 | 0x800;
  }
  if (((local_5a & 1) != 0) || ((local_5e & 1) != 0)) {
    local_64 = local_64 | 0x2000;
  }
  if ((local_5f & 1) != 0) {
    local_64 = local_64 | 0x380;
  }
  if ((local_5d & 1) != 0) {
    local_64 = local_64 | 0x1000;
  }
  if ((local_5e & 1) != 0) {
    uVar1 = local_64 | 0x4000;
    if ((local_64 & 2) != 0) {
      uVar1 = local_64 | 0xc000;
    }
    local_64 = uVar1;
    if ((local_64 & 4) != 0) {
      local_64 = local_64 | 0x10000;
    }
  }
  bVar2 = Globals::getOutputParticlePotential((Globals *)0x2234ca);
  if (bVar2) {
    local_64 = local_64 | 0x40;
  }
  bVar2 = Globals::havePrintHeatFlux((Globals *)0x2234f8);
  if ((bVar2) && (bVar2 = Globals::getPrintHeatFlux((Globals *)0x223515), bVar2)) {
    local_64 = local_64 | 0x40;
  }
  bVar2 = Globals::getOutputElectricField((Globals *)0x223545);
  bVar3 = Globals::haveElectricField((Globals *)0x223566);
  bVar4 = Globals::haveUniformField((Globals *)0x22358d);
  bVar5 = Globals::haveUniformGradientStrength((Globals *)0x2235b4);
  bVar6 = Globals::haveUniformGradientDirection1((Globals *)0x2235db);
  bVar7 = Globals::haveUniformGradientDirection2((Globals *)0x223602);
  Globals::getLightParameters(this_00);
  bVar8 = Perturbations::LightParameters::getUseLight((LightParameters *)0x22363a);
  if ((((((bVar2 || bVar3) || bVar4) || bVar5) || bVar6) || bVar7) || bVar8) {
    local_64 = local_64 | 0x1000;
    local_68 = local_68 | 0x1000;
  }
  Globals::getRNEMDParameters(this_00);
  bVar2 = RNEMD::RNEMDParameters::haveUseRNEMD((RNEMDParameters *)0x223699);
  if (bVar2) {
    Globals::getRNEMDParameters(this_00);
    bVar2 = RNEMD::RNEMDParameters::getUseRNEMD((RNEMDParameters *)0x2236ca);
    if (bVar2) {
      Globals::getRNEMDParameters(this_00);
      bVar2 = RNEMD::RNEMDParameters::requiresElectricField(in_stack_ffffffffffffffc0);
      if (bVar2) {
        local_64 = local_64 | 0x1000;
        local_68 = local_68 | 0x1000;
      }
    }
  }
  bVar2 = Globals::getOutputSitePotential((Globals *)0x22373f);
  if (bVar2) {
    local_64 = local_64 | 0x20000;
    local_68 = local_68 | 0x20000;
  }
  bVar2 = Globals::getOutputFluctuatingCharges((Globals *)0x223782);
  if (bVar2) {
    local_64 = local_64 | 0x1c000;
  }
  SimInfo::setAtomStorageLayout(in_RSI,local_64);
  SimInfo::setRigidBodyStorageLayout(in_RSI,local_68);
  SimInfo::setCutoffGroupStorageLayout(in_RSI,local_6c);
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::~set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x22381a);
  return;
}

Assistant:

void SimCreator::computeStorageLayouts(SimInfo* info) {
    Globals* simParams    = info->getSimParams();
    int nRigidBodies      = info->getNGlobalRigidBodies();
    AtomTypeSet atomTypes = info->getSimulatedAtomTypes();
    AtomTypeSet::iterator i;
    bool hasDirectionalAtoms     = false;
    bool hasFixedCharge          = false;
    bool hasDipoles              = false;
    bool hasQuadrupoles          = false;
    bool hasPolarizable          = false;
    bool hasFluctuatingCharge    = false;
    bool hasMetallic             = false;
    int atomStorageLayout        = 0;
    int rigidBodyStorageLayout   = 0;
    int cutoffGroupStorageLayout = 0;

    atomStorageLayout |= DataStorage::dslPosition;
    atomStorageLayout |= DataStorage::dslVelocity;
    atomStorageLayout |= DataStorage::dslForce;
    cutoffGroupStorageLayout |= DataStorage::dslPosition;

    for (i = atomTypes.begin(); i != atomTypes.end(); ++i) {
      DirectionalAdapter da        = DirectionalAdapter((*i));
      MultipoleAdapter ma          = MultipoleAdapter((*i));
      EAMAdapter ea                = EAMAdapter((*i));
      SuttonChenAdapter sca        = SuttonChenAdapter((*i));
      PolarizableAdapter pa        = PolarizableAdapter((*i));
      FixedChargeAdapter fca       = FixedChargeAdapter((*i));
      FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter((*i));

      if (da.isDirectional()) { hasDirectionalAtoms = true; }
      if (ma.isDipole()) { hasDipoles = true; }
      if (ma.isQuadrupole()) { hasQuadrupoles = true; }
      if (ea.isEAM() || sca.isSuttonChen()) { hasMetallic = true; }
      if (fca.isFixedCharge()) { hasFixedCharge = true; }
      if (fqa.isFluctuatingCharge()) { hasFluctuatingCharge = true; }
      if (pa.isPolarizable()) { hasPolarizable = true; }
    }

    if (nRigidBodies > 0) {
      rigidBodyStorageLayout |= DataStorage::dslPosition;
      rigidBodyStorageLayout |= DataStorage::dslVelocity;
      rigidBodyStorageLayout |= DataStorage::dslForce;
      rigidBodyStorageLayout |= DataStorage::dslAmat;
      rigidBodyStorageLayout |= DataStorage::dslAngularMomentum;
      rigidBodyStorageLayout |= DataStorage::dslTorque;
    }
    if (hasDirectionalAtoms) {
      atomStorageLayout |= DataStorage::dslAmat;
      if (atomStorageLayout & DataStorage::dslVelocity) {
        atomStorageLayout |= DataStorage::dslAngularMomentum;
      }
      if (atomStorageLayout & DataStorage::dslForce) {
        atomStorageLayout |= DataStorage::dslTorque;
      }
    }
    if (hasDipoles) { atomStorageLayout |= DataStorage::dslDipole; }
    if (hasQuadrupoles) { atomStorageLayout |= DataStorage::dslQuadrupole; }
    if (hasFixedCharge || hasFluctuatingCharge) {
      atomStorageLayout |= DataStorage::dslSkippedCharge;
    }
    if (hasMetallic) {
      atomStorageLayout |= DataStorage::dslDensity;
      atomStorageLayout |= DataStorage::dslFunctional;
      atomStorageLayout |= DataStorage::dslFunctionalDerivative;
    }
    if (hasPolarizable) { atomStorageLayout |= DataStorage::dslElectricField; }
    if (hasFluctuatingCharge) {
      atomStorageLayout |= DataStorage::dslFlucQPosition;
      if (atomStorageLayout & DataStorage::dslVelocity) {
        atomStorageLayout |= DataStorage::dslFlucQVelocity;
      }
      if (atomStorageLayout & DataStorage::dslForce) {
        atomStorageLayout |= DataStorage::dslFlucQForce;
      }
    }

    // if the user has asked for them, make sure we've got the memory for the
    // objects defined.

    if (simParams->getOutputParticlePotential()) {
      atomStorageLayout |= DataStorage::dslParticlePot;
    }

    if (simParams->havePrintHeatFlux()) {
      if (simParams->getPrintHeatFlux()) {
        atomStorageLayout |= DataStorage::dslParticlePot;
      }
    }

    if (simParams->getOutputElectricField() | simParams->haveElectricField() |
        simParams->haveUniformField() |
        simParams->haveUniformGradientStrength() |
        simParams->haveUniformGradientDirection1() |
        simParams->haveUniformGradientDirection2() |
        simParams->getLightParameters()->getUseLight()) {
      atomStorageLayout |= DataStorage::dslElectricField;
      rigidBodyStorageLayout |= DataStorage::dslElectricField;
    }

    if (simParams->getRNEMDParameters()->haveUseRNEMD()) {
      if (simParams->getRNEMDParameters()->getUseRNEMD()) {
        if (simParams->getRNEMDParameters()->requiresElectricField()) {
          atomStorageLayout |= DataStorage::dslElectricField;
          rigidBodyStorageLayout |= DataStorage::dslElectricField;
        }
      }
    }

    if (simParams->getOutputSitePotential()) {
      atomStorageLayout |= DataStorage::dslSitePotential;
      rigidBodyStorageLayout |= DataStorage::dslSitePotential;
    }

    if (simParams->getOutputFluctuatingCharges()) {
      atomStorageLayout |= DataStorage::dslFlucQPosition;
      atomStorageLayout |= DataStorage::dslFlucQVelocity;
      atomStorageLayout |= DataStorage::dslFlucQForce;
    }

    info->setAtomStorageLayout(atomStorageLayout);
    info->setRigidBodyStorageLayout(rigidBodyStorageLayout);
    info->setCutoffGroupStorageLayout(cutoffGroupStorageLayout);

    return;
  }